

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerThreadManager.cxx
# Opt level: O0

optional<dap::StackTraceResponse> * __thiscall
cmDebugger::cmDebuggerThreadManager::GetThreadStackTraceResponse
          (optional<dap::StackTraceResponse> *__return_storage_ptr__,cmDebuggerThreadManager *this,
          int64_t id)

{
  bool bVar1;
  reference thread;
  StackTraceResponse local_70;
  _Self local_48;
  int64_t *local_40;
  _List_node_base *local_38;
  _List_iterator<std::shared_ptr<cmDebugger::cmDebuggerThread>_> local_30;
  _Self local_28;
  _List_iterator<std::shared_ptr<cmDebugger::cmDebuggerThread>_> it;
  int64_t id_local;
  cmDebuggerThreadManager *this_local;
  
  it._M_node = (_List_node_base *)id;
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<cmDebugger::cmDebuggerThread>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerThread>_>_>
       ::begin(&this->Threads);
  local_38 = (_List_node_base *)
             std::__cxx11::
             list<std::shared_ptr<cmDebugger::cmDebuggerThread>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerThread>_>_>
             ::end(&this->Threads);
  local_40 = (int64_t *)&it;
  local_28._M_node =
       (_List_node_base *)
       std::
       find_if<std::_List_iterator<std::shared_ptr<cmDebugger::cmDebuggerThread>>,cmDebugger::cmDebuggerThreadManager::GetThreadStackTraceResponse(long)::__0>
                 (local_30,(_List_iterator<std::shared_ptr<cmDebugger::cmDebuggerThread>_>)local_38,
                  (anon_class_8_1_3fcf65d9_for__M_pred)local_40);
  local_48._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<cmDebugger::cmDebuggerThread>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerThread>_>_>
       ::end(&this->Threads);
  bVar1 = std::operator==(&local_28,&local_48);
  if (bVar1) {
    std::optional<dap::StackTraceResponse>::optional(__return_storage_ptr__);
  }
  else {
    thread = std::_List_iterator<std::shared_ptr<cmDebugger::cmDebuggerThread>_>::operator*
                       (&local_28);
    GetStackTraceResponse(&local_70,thread);
    std::optional<dap::StackTraceResponse>::optional<dap::StackTraceResponse,_true>
              (__return_storage_ptr__,&local_70);
    dap::StackTraceResponse::~StackTraceResponse(&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

cm::optional<dap::StackTraceResponse>
cmDebuggerThreadManager::GetThreadStackTraceResponse(int64_t id)
{
  auto it = find_if(Threads.begin(), Threads.end(),
                    [&](const std::shared_ptr<cmDebuggerThread>& t) {
                      return t->GetId() == id;
                    });

  if (it == Threads.end()) {
    return {};
  }

  return GetStackTraceResponse(*it);
}